

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::grow
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *this,size_t MinSize)

{
  move_iterator<llvm::DWARFDebugLoc::Entry_*> __first;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *__ptr;
  ulong uVar1;
  Entry *__result;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                 super_SmallVectorBase.Capacity + 2;
  uVar2 = uVar1 >> 1 | uVar1;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar1 = (uVar1 >> 0x20 | uVar2 >> 0x10 | uVar2) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  if (0xfffffffe < uVar1) {
    uVar1 = 0xffffffff;
  }
  __result = (Entry *)malloc(uVar1 * 0x28);
  if (__result == (Entry *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  __first._M_current =
       (Entry *)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::Entry*>,llvm::DWARFDebugLoc::Entry*>
            (__first,__first._M_current +
                     (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                     super_SmallVectorBase.Size,__result);
  uVar2 = (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
                 super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    pvVar3 = (void *)((long)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>
                            ).super_SmallVectorBase.BeginX + uVar2 * 0x28 + -8);
    lVar4 = uVar2 * -0x28;
    do {
      if (pvVar3 != *(void **)((long)pvVar3 + -0x10)) {
        free(*(void **)((long)pvVar3 + -0x10));
      }
      pvVar3 = (void *)((long)pvVar3 + -0x28);
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0);
  }
  __ptr = (SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *)
          (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).
          super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).super_SmallVectorBase.
  BeginX = __result;
  (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>).super_SmallVectorBase.
  Capacity = (uint)uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}